

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  uint uVar1;
  uint uVar2;
  int in2;
  int iVar3;
  Expr *pExpr_00;
  bool bVar4;
  int local_6c;
  int destIfNull;
  int destIfFalse;
  int isTrue;
  int isNot;
  int d2;
  Expr *pAlt;
  int r2;
  int r1;
  int regFree2;
  int regFree1;
  int op;
  Vdbe *v;
  int jumpIfNull_local;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  _regFree1 = pParse->pVdbe;
  r1 = 0;
  r2 = 0;
  if (_regFree1 == (Vdbe *)0x0) {
    return;
  }
  if (pExpr == (Expr *)0x0) {
    return;
  }
  regFree2 = (int)pExpr->op;
  v._0_4_ = jumpIfNull;
  v._4_4_ = dest;
  _jumpIfNull_local = pExpr;
  pExpr_local = (Expr *)pParse;
  switch(regFree2) {
  case 0x13:
    sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
    break;
  default:
    goto LAB_00233cbe;
  case 0x2b:
  case 0x2c:
    pExpr_00 = sqlite3ExprSimplifiedAndOr(pExpr);
    if (pExpr_00 == _jumpIfNull_local) {
      if (regFree2 == 0x2c) {
        iVar3 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
        sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pLeft,iVar3,(uint)v ^ 0x10);
        sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
        sqlite3VdbeResolveLabel(_regFree1,iVar3);
      }
      else {
        sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,(uint)v);
        sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
      }
    }
    else {
      sqlite3ExprIfTrue((Parse *)pExpr_local,pExpr_00,v._4_4_,(uint)v);
    }
    break;
  case 0x2d:
  case 0xa0:
    bVar4 = regFree2 == 0x2d;
    regFree2 = 0x34;
    if (bVar4) {
      regFree2 = 0x35;
    }
    v._0_4_ = 0x80;
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar3 = sqlite3ExprIsVector(pExpr->pLeft);
    if (iVar3 == 0) {
      iVar3 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pLeft,&r1);
      in2 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pRight,&r2);
      codeCompare((Parse *)pExpr_local,_jumpIfNull_local->pLeft,_jumpIfNull_local->pRight,regFree2,
                  iVar3,in2,v._4_4_,(uint)v);
    }
    else {
LAB_00233cbe:
      if ((_jumpIfNull_local->flags & 0x10000001) == 0x10000000) {
        sqlite3VdbeGoto(_regFree1,v._4_4_);
      }
      else if ((_jumpIfNull_local->flags & 0x20000001) != 0x20000000) {
        iVar3 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local,&r1);
        sqlite3VdbeAddOp3(_regFree1,0x12,iVar3,v._4_4_,(uint)((uint)v != 0));
      }
    }
    break;
  case 0x30:
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfTrue,jumpIfNull);
    break;
  case 0x31:
    iVar3 = sqlite3VdbeMakeLabel(pParse);
    local_6c = iVar3;
    if ((uint)v != 0) {
      local_6c = v._4_4_;
    }
    sqlite3ExprCodeIN((Parse *)pExpr_local,_jumpIfNull_local,iVar3,local_6c);
    sqlite3VdbeGoto(_regFree1,v._4_4_);
    sqlite3VdbeResolveLabel(_regFree1,iVar3);
    break;
  case 0x32:
  case 0x33:
    iVar3 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&r1);
    sqlite3VdbeAddOp2(_regFree1,regFree2,iVar3,v._4_4_);
    break;
  case 0xa7:
    uVar1 = (uint)(pExpr->op2 == 0xa0);
    uVar2 = sqlite3ExprTruthValue(pExpr->pRight);
    if (uVar2 == uVar1) {
      iVar3 = 0;
      if (uVar1 != 0) {
        iVar3 = 0x10;
      }
      sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,iVar3);
    }
    else {
      iVar3 = 0;
      if (uVar1 != 0) {
        iVar3 = 0x10;
      }
      sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,iVar3);
    }
  }
  sqlite3ReleaseTempReg((Parse *)pExpr_local,r1);
  sqlite3ReleaseTempReg((Parse *)pExpr_local,r2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  op = pExpr->op;
  switch( op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfTrue(pParse, pAlt, dest, jumpIfNull);
      }else if( op==TK_AND ){
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,
                           jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }else{
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;      /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;     /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? SQLITE_JUMPIFNULL : 0);
      }else{
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? SQLITE_JUMPIFNULL : 0);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfTrue, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeGoto(v, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
    default_expr:
      if( ExprAlwaysTrue(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysFalse(pExpr) ){
        /* No-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);  
}